

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

ParseableFunctionInfo * __thiscall Js::FunctionProxy::EnsureDeserialized(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  FunctionBody *ptr;
  
  if ((((this->functionInfo).ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x81a,"(this == this->GetFunctionInfo()->GetFunctionProxy())",
                                "this == this->GetFunctionInfo()->GetFunctionProxy()");
    if (!bVar2) goto LAB_006c93e1;
    *puVar5 = 0;
  }
  BVar3 = IsDeferredDeserializeFunction(this);
  if (BVar3 != 0) {
    iVar4 = (*(this->m_scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((char)iVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x821,"(!m_scriptContext->IsClosed())",
                                  "!m_scriptContext->IsClosed()");
      if (!bVar2) goto LAB_006c93e1;
      *puVar5 = 0;
    }
    ptr = DeferDeserializeFunctionInfo::Deserialize((DeferDeserializeFunctionInfo *)this);
    Memory::WriteBarrierPtr<Js::FunctionProxy>::WriteBarrierSet
              (&((this->functionInfo).ptr)->functionBodyImpl,(FunctionProxy *)ptr);
    if ((((ptr->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl
        ).ptr == (FunctionProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x825,"(executionFunctionBody->GetFunctionInfo()->HasBody())",
                                  "executionFunctionBody->GetFunctionInfo()->HasBody()");
      if (!bVar2) goto LAB_006c93e1;
      *puVar5 = 0;
    }
    bVar2 = ptr == (FunctionBody *)this;
    this = (FunctionProxy *)ptr;
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x826,"(executionFunctionBody != this)",
                                  "executionFunctionBody != this");
      if (!bVar2) {
LAB_006c93e1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  return &((FunctionBody *)this)->super_ParseableFunctionInfo;
}

Assistant:

ParseableFunctionInfo * FunctionProxy::EnsureDeserialized()
    {
        Assert(this == this->GetFunctionInfo()->GetFunctionProxy());
        FunctionProxy * executionFunctionBody = this;

        if (IsDeferredDeserializeFunction())
        {
            // No need to deserialize function body if scriptContext closed because we can't execute it.
            // Bigger problem is the script engine might have released bytecode file mapping and we can't deserialize.
            Assert(!m_scriptContext->IsClosed());

            executionFunctionBody = ((DeferDeserializeFunctionInfo*) this)->Deserialize();
            this->GetFunctionInfo()->SetFunctionProxy(executionFunctionBody);
            Assert(executionFunctionBody->GetFunctionInfo()->HasBody());
            Assert(executionFunctionBody != this);
        }

        return (ParseableFunctionInfo *)executionFunctionBody;
    }